

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::Path::isNetbiosName(Path *this,ArrayPtr<const_char> part)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  bool local_3a;
  char c;
  char *__end1;
  char *__begin1;
  ArrayPtr<const_char> *__range1;
  ArrayPtr<const_char> part_local;
  
  part_local.ptr = part.ptr;
  __range1 = (ArrayPtr<const_char> *)this;
  __end1 = ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&__range1);
  pcVar2 = ArrayPtr<const_char>::end((ArrayPtr<const_char> *)&__range1);
  while( true ) {
    if (__end1 == pcVar2) {
      sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&__range1);
      local_3a = false;
      if (sVar3 != 0) {
        pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&__range1,0);
        local_3a = false;
        if (*pcVar2 != '.') {
          pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&__range1,0);
          local_3a = false;
          if (*pcVar2 != '-') {
            sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&__range1);
            pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&__range1,sVar3 - 1);
            local_3a = false;
            if (*pcVar2 != '.') {
              sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&__range1);
              pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&__range1,sVar3 - 1)
              ;
              local_3a = *pcVar2 != '-';
            }
          }
        }
      }
      return local_3a;
    }
    cVar1 = *__end1;
    if (((((cVar1 != '.') && (cVar1 != '-')) && ((cVar1 < 'a' || ('z' < cVar1)))) &&
        ((cVar1 < 'A' || ('Z' < cVar1)))) && ((cVar1 < '0' || ('9' < cVar1)))) break;
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool Path::isNetbiosName(ArrayPtr<const char> part) {
  // Characters must be alphanumeric or '.' or '-'.
  for (char c: part) {
    if (c != '.' && c != '-' &&
        (c < 'a' || 'z' < c) &&
        (c < 'A' || 'Z' < c) &&
        (c < '0' || '9' < c)) {
      return false;
    }
  }

  // Can't be empty nor start or end with a '.' or a '-'.
  return part.size() > 0 &&
      part[0] != '.' && part[0] != '-' &&
      part[part.size() - 1] != '.' && part[part.size() - 1] != '-';
}